

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

optional<long>
wallet::MaxInputWeight
          (Descriptor *desc,optional<CTxIn> *txin,CCoinControl *coin_control,bool tx_is_segwit,
          bool can_grind_r)

{
  long lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  _Storage<long,_true> _Var4;
  int extraout_var_00;
  long lVar5;
  ulong uVar6;
  _Storage<long,_true> _Var7;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  undefined3 in_register_00000081;
  long in_FS_OFFSET;
  optional<long> oVar9;
  ulong uStack_30;
  int extraout_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  if (CONCAT31(in_register_00000081,can_grind_r) != 0) {
    if (coin_control == (CCoinControl *)0x0) {
LAB_0098a3e7:
      bVar3 = false;
    }
    else if (coin_control->fAllowWatchOnly == false) {
      if ((txin->super__Optional_base<CTxIn,_false,_false>)._M_payload.
          super__Optional_payload<CTxIn,_true,_false,_false>.super__Optional_payload_base<CTxIn>.
          _M_engaged != true) goto LAB_0098a3e7;
      bVar3 = CCoinControl::IsExternalSelected(coin_control,(COutPoint *)txin);
    }
  }
  _Var4._0_4_ = (*desc->_vptr_Descriptor[0xd])(desc,(ulong)bVar3);
  _Var4._M_value._4_4_ = extraout_var;
  _Var7 = _Var4;
  if ((extraout_RDX & 1) != 0) {
    _Var7._0_4_ = (*desc->_vptr_Descriptor[0xe])(desc);
    _Var7._M_value._4_4_ = extraout_var_00;
    if ((extraout_RDX_00 & 1) != 0) {
      bVar3 = IsSegwit(desc);
      if (bVar3) {
        lVar5 = 0xa4;
        uVar8 = extraout_RDX_01;
        if ((ulong)_Var7 < 0xfd) {
          uStack_30 = 1;
        }
        else if ((ulong)_Var7 < 0x10000) {
          uStack_30 = 3;
        }
        else {
          uStack_30 = (ulong)(extraout_var_00 != 0) * 4 + 5;
        }
      }
      else {
        auVar2._8_8_ = (long)extraout_var >> 0x1f;
        auVar2._0_8_ = _Var4._M_value;
        uVar6 = SUB168(auVar2 / SEXT816(4),0);
        uVar8 = SUB168(auVar2 % SEXT816(4),0);
        lVar5 = 0xa4;
        if ((0xfc < uVar6) && (lVar5 = 0xac, 0xffff < uVar6)) {
          lVar5 = (ulong)(uVar6 >> 0x20 != 0) * 0x10 + 0xb4;
        }
        uStack_30 = (ulong)tx_is_segwit;
      }
      _Var7._M_value = lVar5 + uStack_30 + _Var4._M_value;
      uVar8 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
      goto LAB_0098a498;
    }
  }
  uVar8 = 0;
LAB_0098a498:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar8;
  oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = _Var7._M_value;
  return (optional<long>)
         oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

static std::optional<int64_t> MaxInputWeight(const Descriptor& desc, const std::optional<CTxIn>& txin,
                                             const CCoinControl* coin_control, const bool tx_is_segwit,
                                             const bool can_grind_r) {
    if (const auto sat_weight = desc.MaxSatisfactionWeight(!can_grind_r || UseMaxSig(txin, coin_control))) {
        if (const auto elems_count = desc.MaxSatisfactionElems()) {
            const bool is_segwit = IsSegwit(desc);
            // Account for the size of the scriptsig and the number of elements on the witness stack. Note
            // that if any input in the transaction is spending a witness program, we need to specify the
            // witness stack size for every input regardless of whether it is segwit itself.
            // NOTE: this also works in case of mixed scriptsig-and-witness such as in p2sh-wrapped segwit v0
            // outputs. In this case the size of the scriptsig length will always be one (since the redeemScript
            // is always a push of the witness program in this case, which is smaller than 253 bytes).
            const int64_t scriptsig_len = is_segwit ? 1 : GetSizeOfCompactSize(*sat_weight / WITNESS_SCALE_FACTOR);
            const int64_t witstack_len = is_segwit ? GetSizeOfCompactSize(*elems_count) : (tx_is_segwit ? 1 : 0);
            // previous txid + previous vout + sequence + scriptsig len + witstack size + scriptsig or witness
            // NOTE: sat_weight already accounts for the witness discount accordingly.
            return (32 + 4 + 4 + scriptsig_len) * WITNESS_SCALE_FACTOR + witstack_len + *sat_weight;
        }
    }

    return {};
}